

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O0

void __thiscall OpenMD::Bond::Bond(Bond *this,Atom *atom1,Atom *atom2,BondType *bt)

{
  reference ppAVar1;
  undefined8 in_RCX;
  value_type in_RDX;
  value_type in_RSI;
  undefined8 *in_RDI;
  ShortRangeInteraction *in_stack_ffffffffffffffc0;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_stack_ffffffffffffffd0;
  
  ShortRangeInteraction::ShortRangeInteraction(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__Bond_004fd828;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = in_RCX;
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::resize
            (in_stack_ffffffffffffffd0,(size_type)in_RDI);
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 2),0);
  *ppAVar1 = in_RSI;
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 2),1);
  *ppAVar1 = in_RDX;
  return;
}

Assistant:

Bond(Atom* atom1, Atom* atom2, BondType* bt) :
        ShortRangeInteraction(), bondType_(bt) {
      atoms_.resize(2);
      atoms_[0] = atom1;
      atoms_[1] = atom2;
    }